

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

bool rtc::tokenize_first(string *source,char delimiter,string *token,string *rest)

{
  char *pcVar1;
  string local_80 [32];
  string local_60 [32];
  size_t local_40;
  size_t right_pos;
  size_t left_pos;
  string *rest_local;
  string *token_local;
  string *psStack_18;
  char delimiter_local;
  string *source_local;
  
  left_pos = (size_t)rest;
  rest_local = token;
  token_local._7_1_ = delimiter;
  psStack_18 = source;
  right_pos = std::__cxx11::string::find((char)source,(ulong)(uint)(int)delimiter);
  local_40 = right_pos;
  if (right_pos == 0xffffffffffffffff) {
    source_local._7_1_ = false;
  }
  else {
    do {
      local_40 = local_40 + 1;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    } while (*pcVar1 == token_local._7_1_);
    std::__cxx11::string::substr((ulong)local_60,(ulong)psStack_18);
    std::__cxx11::string::operator=((string *)rest_local,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::substr((ulong)local_80,(ulong)psStack_18);
    std::__cxx11::string::operator=((string *)left_pos,local_80);
    std::__cxx11::string::~string(local_80);
    source_local._7_1_ = true;
  }
  return source_local._7_1_;
}

Assistant:

bool tokenize_first(const std::string& source,
                    const char delimiter,
                    std::string* token,
                    std::string* rest) {
  // Find the first delimiter
  size_t left_pos = source.find(delimiter);
  if (left_pos == std::string::npos) {
    return false;
  }

  // Look for additional occurrances of delimiter.
  size_t right_pos = left_pos + 1;
  while (source[right_pos] == delimiter) {
    right_pos++;
  }

  *token = source.substr(0, left_pos);
  *rest = source.substr(right_pos);
  return true;
}